

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

int av1_find_qindex(double desired_q,aom_bit_depth_t bit_depth,int best_qindex,int worst_qindex)

{
  int qindex;
  double dVar1;
  
  if (best_qindex < worst_qindex) {
    do {
      qindex = best_qindex + worst_qindex >> 1;
      dVar1 = av1_convert_qindex_to_q(qindex,bit_depth);
      if (dVar1 < desired_q) {
        best_qindex = qindex + 1;
        qindex = worst_qindex;
      }
      worst_qindex = qindex;
    } while (best_qindex < worst_qindex);
  }
  return best_qindex;
}

Assistant:

int av1_find_qindex(double desired_q, aom_bit_depth_t bit_depth,
                    int best_qindex, int worst_qindex) {
  assert(best_qindex <= worst_qindex);
  int low = best_qindex;
  int high = worst_qindex;
  while (low < high) {
    const int mid = (low + high) >> 1;
    const double mid_q = av1_convert_qindex_to_q(mid, bit_depth);
    if (mid_q < desired_q) {
      low = mid + 1;
    } else {
      high = mid;
    }
  }
  assert(low == high);
  assert(av1_convert_qindex_to_q(low, bit_depth) >= desired_q ||
         low == worst_qindex);
  return low;
}